

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O2

void __thiscall HttpSession::on_read(HttpSession *this,error_code eCode,size_t bytes_transferred)

{
  ulong_long_type uVar1;
  bool bVar2;
  error_category *peVar3;
  error_code eVar4;
  error_code eCode_local;
  error_code local_28;
  
  peVar3 = eCode.cat_;
  eCode_local._0_8_ = eCode._0_8_;
  eCode_local.cat_ = peVar3;
  eVar4 = boost::beast::http::make_error_code(end_of_stream);
  if (eCode.val_ == eVar4.val_) {
    uVar1 = (eVar4.cat_)->id_;
    bVar2 = peVar3->id_ == uVar1;
    if (uVar1 == 0) {
      bVar2 = eVar4.cat_ == peVar3;
    }
    if (bVar2) {
      do_close(this);
      return;
    }
  }
  if ((eCode._0_8_ >> 0x20 & 1) == 0) {
    handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>
              (&this->req,&this->lambda);
    return;
  }
  local_28 = boost::beast::make_error_code(timeout);
  bVar2 = boost::system::operator!=(&local_28,&eCode_local);
  if (bVar2) {
    eVar4.cat_ = eCode_local.cat_;
    eVar4.val_ = eCode_local.val_;
    eVar4.failed_ = eCode_local.failed_;
    eVar4._5_3_ = eCode_local._5_3_;
    fail(eVar4,"helics web server read");
  }
  return;
}

Assistant:

void on_read(beast::error_code eCode, std::size_t bytes_transferred)
    {
        boost::ignore_unused(bytes_transferred);

        // This means they closed the connection
        if (eCode == http::error::end_of_stream) {
            return do_close();
        }

        if (eCode) {
            if (beast::error::timeout != eCode) {
                fail(eCode, "helics web server read");
            }
            return;
        }

        // Send the response
        handle_request(std::move(req), lambda);
    }